

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.h
# Opt level: O1

void __thiscall
chrono::ChTimestepperRungeKuttaExpl::~ChTimestepperRungeKuttaExpl(ChTimestepperRungeKuttaExpl *this)

{
  double *pdVar1;
  
  (this->super_ChTimestepperIorder).super_ChTimestepper._vptr_ChTimestepper =
       (_func_int **)&PTR__ChTimestepperRungeKuttaExpl_00b6b280;
  pdVar1 = (this->Dydt4).super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (pdVar1 != (double *)0x0) {
    free((void *)pdVar1[-1]);
  }
  pdVar1 = (this->Dydt3).super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (pdVar1 != (double *)0x0) {
    free((void *)pdVar1[-1]);
  }
  pdVar1 = (this->Dydt2).super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (pdVar1 != (double *)0x0) {
    free((void *)pdVar1[-1]);
  }
  pdVar1 = (this->Dydt1).super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (pdVar1 != (double *)0x0) {
    free((void *)pdVar1[-1]);
  }
  pdVar1 = (this->y_new).super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (pdVar1 != (double *)0x0) {
    free((void *)pdVar1[-1]);
  }
  ChTimestepperIorder::~ChTimestepperIorder(&this->super_ChTimestepperIorder);
  operator_delete(this,0xe0);
  return;
}

Assistant:

class ChApi ChTimestepperRungeKuttaExpl : public ChTimestepperIorder {
  protected:
    ChState y_new;
    ChStateDelta Dydt1;
    ChStateDelta Dydt2;
    ChStateDelta Dydt3;
    ChStateDelta Dydt4;

  public:
    /// Constructors (default empty)
    ChTimestepperRungeKuttaExpl(ChIntegrable* intgr = nullptr) : ChTimestepperIorder(intgr) {}

    virtual Type GetType() const override { return Type::RUNGEKUTTA45; }

    /// Performs an integration timestep
    virtual void Advance(const double dt  ///< timestep to advance
                         ) override;
}